

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::FloatingEqMatcher<double>::Impl<double>::DescribeTo
          (Impl<double> *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  FloatingPoint<double> local_28;
  streamsize local_20;
  streamsize old_precision;
  ostream *os_local;
  Impl<double> *this_local;
  
  old_precision = (streamsize)os;
  os_local = (ostream *)this;
  local_20 = std::ios_base::precision((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0x11);
  FloatingPoint<double>::FloatingPoint(&local_28,&this->expected_);
  bVar1 = FloatingPoint<double>::is_nan(&local_28);
  if (bVar1) {
    if ((this->nan_eq_nan_ & 1U) == 0) {
      std::operator<<((ostream *)old_precision,"never matches");
    }
    else {
      std::operator<<((ostream *)old_precision,"is NaN");
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)old_precision,"is approximately ");
    std::ostream::operator<<(poVar2,this->expected_);
    bVar1 = HasMaxAbsError(this);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)old_precision," (absolute error <= ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->max_abs_error_);
      std::operator<<(poVar2,")");
    }
  }
  std::ios_base::precision
            ((ios_base *)(old_precision + *(long *)(*(long *)old_precision + -0x18)),local_20);
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
      // os->precision() returns the previously set precision, which we
      // store to restore the ostream to its original configuration
      // after outputting.
      const ::std::streamsize old_precision = os->precision(
          ::std::numeric_limits<FloatType>::digits10 + 2);
      if (FloatingPoint<FloatType>(expected_).is_nan()) {
        if (nan_eq_nan_) {
          *os << "is NaN";
        } else {
          *os << "never matches";
        }
      } else {
        *os << "is approximately " << expected_;
        if (HasMaxAbsError()) {
          *os << " (absolute error <= " << max_abs_error_ << ")";
        }
      }
      os->precision(old_precision);
    }